

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O2

void __thiscall unitStrings_Hertz_Test::TestBody(unitStrings_Hertz_Test *this)

{
  precise_unit *ppVar1;
  uint64_t in_RCX;
  string *psVar2;
  string *psVar3;
  char *pcVar4;
  AssertionResult gtest_ar;
  precise_unit local_40;
  string local_30;
  
  ppVar1 = (precise_unit *)units::getDefaultFlags();
  psVar2 = &local_30;
  units::to_string_abi_cxx11_(psVar2,(units *)units::precise::Hz,ppVar1,in_RCX);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)&gtest_ar,"to_string(precise::Hz)","\"Hz\"",psVar2,(char (*) [3])0x1d6b3b);
  std::__cxx11::string::~string((string *)&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    psVar2 = (string *)0x19e;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x19e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if ((long *)local_30._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_40 = units::precise_unit::operator*
                       ((precise_unit *)units::precise::milli,(precise_unit *)units::precise::Hz);
  ppVar1 = (precise_unit *)units::getDefaultFlags();
  psVar3 = &local_30;
  units::to_string_abi_cxx11_(psVar3,(units *)&local_40,ppVar1,(uint64_t)psVar2);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)&gtest_ar,"to_string(precise::milli * precise::Hz)","\"mHz\"",psVar3,
             (char (*) [4])"mHz");
  std::__cxx11::string::~string((string *)&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    psVar3 = (string *)0x19f;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x19f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if ((long *)local_30._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_40 = units::precise_unit::operator*
                       ((precise_unit *)units::precise::kilo,(precise_unit *)units::precise::Hz);
  ppVar1 = (precise_unit *)units::getDefaultFlags();
  psVar2 = &local_30;
  units::to_string_abi_cxx11_(psVar2,(units *)&local_40,ppVar1,(uint64_t)psVar3);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)&gtest_ar,"to_string(precise::kilo * precise::Hz)","\"kHz\"",psVar2,
             (char (*) [4])"kHz");
  std::__cxx11::string::~string((string *)&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    psVar2 = (string *)0x1a0;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1a0,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if ((long *)local_30._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_40 = units::precise_unit::operator*
                       ((precise_unit *)units::precise::mega,(precise_unit *)units::precise::Hz);
  ppVar1 = (precise_unit *)units::getDefaultFlags();
  psVar3 = &local_30;
  units::to_string_abi_cxx11_(psVar3,(units *)&local_40,ppVar1,(uint64_t)psVar2);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)&gtest_ar,"to_string(precise::mega * precise::Hz)","\"MHz\"",psVar3,
             (char (*) [4])"MHz");
  std::__cxx11::string::~string((string *)&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    psVar3 = (string *)0x1a1;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1a1,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if ((long *)local_30._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_40 = units::precise_unit::operator*
                       ((precise_unit *)units::precise::giga,(precise_unit *)units::precise::Hz);
  ppVar1 = (precise_unit *)units::getDefaultFlags();
  psVar2 = &local_30;
  units::to_string_abi_cxx11_(psVar2,(units *)&local_40,ppVar1,(uint64_t)psVar3);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)&gtest_ar,"to_string(precise::giga * precise::Hz)","\"GHz\"",psVar2,
             (char (*) [4])"GHz");
  std::__cxx11::string::~string((string *)&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    psVar2 = (string *)0x1a2;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1a2,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if ((long *)local_30._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_40 = units::precise_unit::operator*
                       ((precise_unit *)units::precise::tera,(precise_unit *)units::precise::Hz);
  ppVar1 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_30,(units *)&local_40,ppVar1,(uint64_t)psVar2);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)&gtest_ar,"to_string(precise::tera * precise::Hz)","\"THz\"",&local_30,
             (char (*) [4])"THz");
  std::__cxx11::string::~string((string *)&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1a3,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if ((long *)local_30._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(unitStrings, Hertz)
{
    EXPECT_EQ(to_string(precise::Hz), "Hz");
    EXPECT_EQ(to_string(precise::milli * precise::Hz), "mHz");
    EXPECT_EQ(to_string(precise::kilo * precise::Hz), "kHz");
    EXPECT_EQ(to_string(precise::mega * precise::Hz), "MHz");
    EXPECT_EQ(to_string(precise::giga * precise::Hz), "GHz");
    EXPECT_EQ(to_string(precise::tera * precise::Hz), "THz");
}